

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O3

unique_ptr<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_> mp::CreateFlatModelInfo(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>,_true,_true> in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0xd0);
  memset(puVar1 + 4,0,0xb0);
  *puVar1 = &PTR__FlatModelInfoImpl_005d4ec0;
  puVar1[1] = puVar1 + 7;
  puVar1[2] = 1;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined4 *)(puVar1 + 5) = 0x3f800000;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = puVar1 + 0xe;
  puVar1[9] = 1;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  *(undefined4 *)(puVar1 + 0xc) = 0x3f800000;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0x11] = 0;
  puVar1[0x12] = puVar1 + 0x10;
  puVar1[0x13] = puVar1 + 0x10;
  puVar1[0x14] = 0;
  puVar1[0x15] = 0;
  puVar1[0x16] = 0;
  puVar1[0x17] = 0;
  *(undefined4 *)(puVar1 + 0x18) = 0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_>._M_t.
   super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>.
   super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>,_true,_true>)
         (tuple<mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>)
         in_RDI.super___uniq_ptr_impl<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_>.
         _M_t.super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>.
         super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FlatModelInfo> CreateFlatModelInfo() {
  return std::unique_ptr<FlatModelInfo>{new FlatModelInfoImpl()};
}